

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::_::XThreadEvent_*>::setCapacity(Vector<kj::_::XThreadEvent_*> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::_::XThreadEvent_*> *pAVar2;
  size_t __length;
  size_t extraout_RDX;
  size_t size;
  undefined1 local_38 [8];
  ArrayBuilder<kj::_::XThreadEvent_*> newBuilder;
  size_t newSize_local;
  Vector<kj::_::XThreadEvent_*> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<kj::_::XThreadEvent_*>::size(&this->builder);
  size = __length;
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::_::XThreadEvent_*>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
    size = extraout_RDX;
  }
  heapArrayBuilder<kj::_::XThreadEvent*>
            ((ArrayBuilder<kj::_::XThreadEvent_*> *)local_38,(kj *)newBuilder.disposer,size);
  pAVar2 = mv<kj::ArrayBuilder<kj::_::XThreadEvent*>>(&this->builder);
  ArrayBuilder<kj::_::XThreadEvent*>::addAll<kj::ArrayBuilder<kj::_::XThreadEvent*>>
            ((ArrayBuilder<kj::_::XThreadEvent*> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::_::XThreadEvent*>>
                     ((ArrayBuilder<kj::_::XThreadEvent_*> *)local_38);
  ArrayBuilder<kj::_::XThreadEvent_*>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::_::XThreadEvent_*>::~ArrayBuilder
            ((ArrayBuilder<kj::_::XThreadEvent_*> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }